

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
array<CGlyphIndex,_allocator_default<CGlyphIndex>_>::alloc
          (array<CGlyphIndex,_allocator_default<CGlyphIndex>_> *this,int new_len)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  CGlyphIndex *pCVar3;
  undefined8 uVar4;
  int iVar5;
  CGlyphIndex *pCVar6;
  long lVar7;
  ulong uVar8;
  
  this->list_size = new_len;
  uVar8 = 0xffffffffffffffff;
  if (-1 < new_len) {
    uVar8 = (long)new_len << 4;
  }
  pCVar6 = (CGlyphIndex *)operator_new__(uVar8);
  if (this->num_elements < new_len) {
    new_len = this->num_elements;
  }
  if (0 < new_len) {
    pCVar3 = this->list;
    lVar7 = 0;
    do {
      puVar1 = (undefined8 *)((long)&pCVar3->m_FontSizeIndex + lVar7);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pCVar6->m_FontSizeIndex + lVar7);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      lVar7 = lVar7 + 0x10;
    } while ((ulong)(uint)new_len << 4 != lVar7);
  }
  if (this->list != (CGlyphIndex *)0x0) {
    operator_delete__(this->list);
  }
  iVar5 = this->list_size;
  if (this->num_elements < this->list_size) {
    iVar5 = this->num_elements;
  }
  this->num_elements = iVar5;
  this->list = pCVar6;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}